

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

uint8_t * pad_title_screen(uint8_t *pos,uint8_t *end,int reserved)

{
  uint8_t *puVar1;
  uint32_t local_58;
  uint32_t local_4c;
  uint8_t local_48 [4];
  int needed;
  char text [32];
  int reserved_local;
  uint8_t *end_local;
  uint8_t *pos_local;
  
  if ((long)(end + (-(long)reserved - (long)pos) + -1) < 0x20) {
    local_58 = (((int)end - (int)pos) - reserved) - 1;
  }
  else {
    local_58 = 0x20;
  }
  local_4c = local_58;
  if ((int)local_58 < 0) {
    printf("An unexpected error occurred while updating the title screen!\n");
  }
  memset(local_48,0x5f,0x20);
  end_local = pos;
  if ((int)local_58 < 0x20) {
    local_4c = local_58 - 3;
    end_local = pvpatch(pos,3,0xf7,(ulong)(0x20 - local_4c),0x5f);
  }
  puVar1 = ppatch(end_local,local_4c,local_48);
  puVar1 = pvpatch(puVar1,1,0xfc);
  return puVar1;
}

Assistant:

static uint8_t *pad_title_screen(uint8_t *pos, uint8_t *end, int reserved)
{
    char text[32];
    int needed;

    needed = MIN(end - pos - reserved - 1, 32);
    if (needed < 0) {
        printf("An unexpected error occurred while updating the title "
                       "screen!\n");
    }
    memset(text, 0x5f, 32);
    if (needed < 32) {
        needed -= 3;
        pos = pvpatch(pos, 3, 0xf7, 32 - needed, 0x5f);
    }
    pos = ppatch(pos, needed, (uint8_t*)text);
    pos = pvpatch(pos, 1, 0xfc);
    return pos;
}